

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O3

object * find_stack_object_in_inventory(object *obj,object *start)

{
  _Bool _Var1;
  
  if (start != (object *)0x0) goto LAB_00133871;
  start = player->gear;
  while( true ) {
    if (start == (object *)0x0) {
      return (object *)0x0;
    }
LAB_00133871:
    _Var1 = object_is_equipped(player->body,start);
    if ((!_Var1) && (_Var1 = object_similar(start,obj,OSTACK_PACK), _Var1)) break;
    start = start->next;
  }
  return start;
}

Assistant:

static const struct object *find_stack_object_in_inventory(const struct object *obj, const struct object *start)
{
	const struct object *gear_obj;
	for (gear_obj = (start) ? start : player->gear; gear_obj; gear_obj = gear_obj->next) {
		if (!object_is_equipped(player->body, gear_obj) &&
				object_similar(gear_obj, obj, OSTACK_PACK)) {
			/* We found the object */
			return gear_obj;
		}
	}

	return NULL;
}